

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  string *psVar1;
  uchar value;
  byte bVar2;
  char *pcVar3;
  uint uVar4;
  size_t i;
  ulong uVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  string *local_58;
  string local_50;
  
  local_58 = __return_storage_ptr__;
  Message::Message((Message *)&local_60);
  uVar5 = 0;
  do {
    psVar1 = local_58;
    if (str->_M_string_length <= uVar5) {
      StringStreamToString(local_58,local_60._M_head_impl);
      if (local_60._M_head_impl != (stringstream *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
      return psVar1;
    }
    bVar2 = (str->_M_dataplus)._M_p[uVar5];
    if (bVar2 == 0x22) {
      if (is_attribute) {
        pcVar3 = "&quot;";
        goto LAB_00136926;
      }
      bVar2 = 0x22;
LAB_00136943:
      std::operator<<((ostream *)(local_60._M_head_impl + 0x10),bVar2);
    }
    else {
      if (bVar2 == 0x26) {
        pcVar3 = "&amp;";
      }
      else if (bVar2 == 0x27) {
        if (!is_attribute) {
          bVar2 = 0x27;
          goto LAB_00136943;
        }
        pcVar3 = "&apos;";
      }
      else if (bVar2 == 0x3e) {
        pcVar3 = "&gt;";
      }
      else {
        if (bVar2 != 0x3c) {
          uVar4 = (uint)bVar2;
          if (('\x1f' < (char)bVar2) || ((bVar2 < 0xe && ((0x2600U >> (uVar4 & 0x1f) & 1) != 0)))) {
            if ((!is_attribute) || ((0xd < uVar4 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0))))
            goto LAB_00136943;
            std::operator<<((ostream *)(local_60._M_head_impl + 0x10),"&#x");
            String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)uVar4,value);
            std::operator<<((ostream *)(local_60._M_head_impl + 0x10),(string *)&local_50);
            std::operator<<((ostream *)(local_60._M_head_impl + 0x10),";");
            std::__cxx11::string::_M_dispose();
          }
          goto LAB_00136948;
        }
        pcVar3 = "&lt;";
      }
LAB_00136926:
      std::operator<<((ostream *)(local_60._M_head_impl + 0x10),pcVar3);
    }
LAB_00136948:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}